

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3Fts5MallocZero(int *pRc,sqlite3_int64 nByte)

{
  void *pvVar1;
  
  if (*pRc == 0) {
    pvVar1 = sqlite3_malloc64(nByte);
    if (pvVar1 != (void *)0x0) {
      pvVar1 = memset(pvVar1,0,nByte);
      return pvVar1;
    }
    if (0 < nByte) {
      *pRc = 7;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *sqlite3Fts5MallocZero(int *pRc, sqlite3_int64 nByte){
  void *pRet = 0;
  if( *pRc==SQLITE_OK ){
    pRet = sqlite3_malloc64(nByte);
    if( pRet==0 ){
      if( nByte>0 ) *pRc = SQLITE_NOMEM;
    }else{
      memset(pRet, 0, (size_t)nByte);
    }
  }
  return pRet;
}